

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::microfacet::g2(microfacet *this,vec3 *wm,vec3 *wi,vec3 *wo,args *args)

{
  float fVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Da_00;
  vec3 vVar4;
  
  fVar1 = 0.0;
  if (0.0 < wm->z) {
    fVar2 = wi->z;
    fVar1 = 0.0;
    if ((0.0 < fVar2) && (fVar3 = wo->z, 0.0 < fVar3)) {
      vVar4 = djb::operator*(&args->minv,wi);
      fVar1 = vVar4.z * vVar4.z + vVar4.x * vVar4.x + vVar4.y * vVar4.y;
      if (fVar1 < 0.0) {
        fVar1 = sqrtf(fVar1);
      }
      else {
        fVar1 = SQRT(fVar1);
      }
      fVar2 = fVar2 * fVar3;
      (*(this->super_brdf)._vptr_brdf[10])(this);
      vVar4 = djb::operator*(&args->minv,wo);
      fVar3 = vVar4.z * vVar4.z + vVar4.x * vVar4.x + vVar4.y * vVar4.y;
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      (*(this->super_brdf)._vptr_brdf[10])(this);
      fVar1 = fVar2 / ((extraout_XMM0_Da * fVar1 * wo->z + extraout_XMM0_Da_00 * fVar3 * wi->z) -
                      fVar2);
    }
  }
  return fVar1;
}

Assistant:

float_t
microfacet::g2(
	const vec3 &wm,
	const vec3 &wi,
	const vec3 &wo,
	const args &args
) const {
	if (wm.z > 0 && wi.z > 0 && wo.z > 0) {
		float_t zizo = wi.z * wo.z;
		float_t sigma_i = sigma(wi, args);
		float_t sigma_o = sigma(wo, args);
		return zizo / (sigma_i * wo.z + sigma_o * wi.z - zizo);
	}
	return 0;
}